

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_servergreet_resp(connectdata *conn,int imapcode,imapstate instate)

{
  SessionHandle *data;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  if (imapcode == 0x4f) {
    data._4_4_ = imap_perform_capability(conn);
  }
  else {
    Curl_failf(conn->data,"Got unexpected imap-server response");
    data._4_4_ = CURLE_FTP_WEIRD_SERVER_REPLY;
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_servergreet_resp(struct connectdata *conn,
                                            int imapcode,
                                            imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(imapcode != 'O') {
    failf(data, "Got unexpected imap-server response");
    result = CURLE_FTP_WEIRD_SERVER_REPLY; /* TODO: fix this code */
  }
  else
    result = imap_perform_capability(conn);

  return result;
}